

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O1

uint lodepng::convertFromXYZ
               (uchar *out,float *in,uint w,uint h,LodePNGState *state,float *whitepoint,
               uint rendering_intent)

{
  float *pfVar1;
  char cVar2;
  short sVar10;
  ushort uVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  uint uVar22;
  float *out_00;
  uchar *in_00;
  long lVar23;
  uint uVar24;
  short sVar25;
  uint uVar26;
  uint uVar30;
  uint uVar31;
  undefined1 auVar29 [16];
  undefined1 auVar32 [16];
  short sVar33;
  undefined1 auVar37 [16];
  uint local_1a8;
  LodePNGColorMode mode16;
  LodePNGICC icc;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  undefined4 uVar27;
  undefined6 uVar28;
  undefined8 uVar34;
  undefined1 auVar35 [12];
  undefined1 auVar36 [14];
  undefined1 auVar38 [16];
  
  uVar26 = (state->info_raw).bitdepth;
  icc.trc[0].lut = (float *)0x0;
  icc.trc[0].lut_size = 0;
  icc.trc[1].lut = (float *)0x0;
  icc.trc[1].lut_size = 0;
  icc.trc[2].lut = (float *)0x0;
  icc.trc[2].lut_size = 0;
  if ((state->info_png).iccp_defined == 0) goto LAB_0011d549;
  uVar22 = parseICC(&icc,(state->info_png).iccp_profile,(ulong)(state->info_png).iccp_profile_size);
  if (uVar22 == 0) {
    local_1a8 = icc.inputspace;
    if (icc.inputspace != 0) {
      if (icc.inputspace == 2) {
        if (icc.has_chromaticity == 0) {
LAB_0011d549:
          local_1a8 = 0;
        }
        else {
          local_1a8 = 0;
          if (icc.has_whitepoint != 0) goto LAB_0011d595;
        }
      }
      else {
        if (icc.has_whitepoint == 0) goto LAB_0011d549;
LAB_0011d595:
        local_1a8 = (uint)(icc.has_trc != 0);
      }
    }
    uVar24 = h * w;
    out_00 = (float *)malloc((ulong)(uVar24 * 4) << 2);
    uVar22 = convertFromXYZ_chrm(out_00,in,w,h,&state->info_png,local_1a8,&icc,whitepoint,
                                 rendering_intent);
    if (uVar22 == 0) {
      convertFromXYZ_gamma(out_00,w,h,&state->info_png,local_1a8,&icc);
      in_00 = (uchar *)malloc((ulong)(uVar24 * 8));
      if (uVar26 < 9) {
        lodepng_color_mode_make(LCT_RGBA,8);
        auVar21 = _DAT_0012a570;
        if (uVar24 != 0) {
          lVar23 = 0;
          do {
            pfVar1 = out_00 + lVar23;
            fVar17 = *pfVar1;
            fVar18 = pfVar1[1];
            fVar19 = pfVar1[2];
            fVar20 = pfVar1[3];
            uVar26 = -(uint)(1.0 <= fVar17 || fVar17 < 0.0);
            uVar22 = -(uint)(1.0 <= fVar18 || fVar18 < 0.0);
            uVar30 = -(uint)(1.0 <= fVar19 || fVar19 < 0.0);
            uVar31 = -(uint)(1.0 <= fVar20 || fVar20 < 0.0);
            auVar29._0_4_ =
                 (int)((float)(~uVar26 & (uint)fVar17 |
                              ~-(uint)(fVar17 < 1.0 || fVar17 < 0.0) & 0x3f800000 & uVar26) * 255.0
                      + 0.5);
            auVar29._4_4_ =
                 (int)((float)(~uVar22 & (uint)fVar18 |
                              ~-(uint)(fVar18 < 1.0 || fVar18 < 0.0) & 0x3f800000 & uVar22) * 255.0
                      + 0.5);
            auVar29._8_4_ =
                 (int)((float)(~uVar30 & (uint)fVar19 |
                              ~-(uint)(fVar19 < 1.0 || fVar19 < 0.0) & 0x3f800000 & uVar30) * 255.0
                      + 0.5);
            auVar29._12_4_ =
                 (int)((float)(~uVar31 & (uint)fVar20 |
                              ~-(uint)(fVar20 < 1.0 || fVar20 < 0.0) & 0x3f800000 & uVar31) * 255.0
                      + 0.5);
            auVar29 = auVar29 & auVar21;
            sVar10 = auVar29._0_2_;
            cVar2 = (0 < sVar10) * (sVar10 < 0x100) * auVar29[0] - (0xff < sVar10);
            sVar10 = auVar29._2_2_;
            sVar25 = CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar29[2] - (0xff < sVar10),cVar2);
            sVar10 = auVar29._4_2_;
            cVar3 = (0 < sVar10) * (sVar10 < 0x100) * auVar29[4] - (0xff < sVar10);
            sVar10 = auVar29._6_2_;
            uVar27 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar29[6] - (0xff < sVar10),
                              CONCAT12(cVar3,sVar25));
            sVar10 = auVar29._8_2_;
            cVar4 = (0 < sVar10) * (sVar10 < 0x100) * auVar29[8] - (0xff < sVar10);
            sVar10 = auVar29._10_2_;
            uVar28 = CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar29[10] - (0xff < sVar10),
                              CONCAT14(cVar4,uVar27));
            sVar10 = auVar29._12_2_;
            cVar5 = (0 < sVar10) * (sVar10 < 0x100) * auVar29[0xc] - (0xff < sVar10);
            sVar13 = auVar29._14_2_;
            sVar10 = (short)((uint)uVar27 >> 0x10);
            sVar12 = (short)((uint6)uVar28 >> 0x20);
            sVar13 = (short)(CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar29[0xe] -
                                      (0xff < sVar13),CONCAT16(cVar5,uVar28)) >> 0x30);
            *(uint *)(in_00 + lVar23) =
                 CONCAT13((0 < sVar13) * (sVar13 < 0x100) * cVar5 - (0xff < sVar13),
                          CONCAT12((0 < sVar12) * (sVar12 < 0x100) * cVar4 - (0xff < sVar12),
                                   CONCAT11((0 < sVar10) * (sVar10 < 0x100) * cVar3 -
                                            (0xff < sVar10),
                                            (0 < sVar25) * (sVar25 < 0x100) * cVar2 -
                                            (0xff < sVar25))));
            lVar23 = lVar23 + 4;
          } while ((ulong)uVar24 << 2 != lVar23);
        }
      }
      else {
        lodepng_color_mode_make(LCT_RGBA,0x10);
        auVar21 = _DAT_0012a570;
        if (uVar24 != 0) {
          lVar23 = 0;
          do {
            pfVar1 = (float *)((long)out_00 + lVar23 * 2);
            fVar17 = *pfVar1;
            fVar18 = pfVar1[1];
            fVar19 = pfVar1[2];
            fVar20 = pfVar1[3];
            uVar26 = -(uint)(1.0 <= fVar17 || fVar17 < 0.0);
            uVar22 = -(uint)(1.0 <= fVar18 || fVar18 < 0.0);
            uVar30 = -(uint)(1.0 <= fVar19 || fVar19 < 0.0);
            uVar31 = -(uint)(1.0 <= fVar20 || fVar20 < 0.0);
            uVar26 = (uint)((float)(~uVar26 & (uint)fVar17 |
                                   ~-(uint)(fVar17 < 1.0 || fVar17 < 0.0) & 0x3f800000 & uVar26) *
                            65535.0 + 0.5);
            uVar22 = (uint)((float)(~uVar22 & (uint)fVar18 |
                                   ~-(uint)(fVar18 < 1.0 || fVar18 < 0.0) & 0x3f800000 & uVar22) *
                            65535.0 + 0.5);
            uVar30 = (uint)((float)(~uVar30 & (uint)fVar19 |
                                   ~-(uint)(fVar19 < 1.0 || fVar19 < 0.0) & 0x3f800000 & uVar30) *
                            65535.0 + 0.5);
            uVar31 = (uint)((float)(~uVar31 & (uint)fVar20 |
                                   ~-(uint)(fVar20 < 1.0 || fVar20 < 0.0) & 0x3f800000 & uVar31) *
                            65535.0 + 0.5);
            auVar37._12_4_ = uVar22;
            auVar37._8_4_ = uVar22 >> 8;
            auVar37._4_4_ = uVar26;
            auVar37._0_4_ = uVar26 >> 8;
            auVar32._4_4_ = uVar30;
            auVar32._0_4_ = uVar30 >> 8;
            auVar32._8_4_ = uVar31 >> 8;
            auVar32._12_4_ = uVar31;
            auVar32 = auVar32 & auVar21;
            auVar37 = auVar37 & auVar21;
            sVar10 = auVar37._0_2_;
            cVar2 = (0 < sVar10) * (sVar10 < 0x100) * auVar37[0] - (0xff < sVar10);
            uVar11 = auVar37._2_2_;
            sVar33 = CONCAT11((uVar11 != 0) * (uVar11 < 0x100) * auVar37[2] - (0xff < uVar11),cVar2)
            ;
            sVar10 = auVar37._4_2_;
            cVar3 = (0 < sVar10) * (sVar10 < 0x100) * auVar37[4] - (0xff < sVar10);
            sVar10 = auVar37._6_2_;
            uVar27 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar37[6] - (0xff < sVar10),
                              CONCAT12(cVar3,sVar33));
            sVar10 = auVar37._8_2_;
            cVar4 = (0 < sVar10) * (sVar10 < 0x100) * auVar37[8] - (0xff < sVar10);
            sVar10 = auVar37._10_2_;
            uVar28 = CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar37[10] - (0xff < sVar10),
                              CONCAT14(cVar4,uVar27));
            sVar10 = auVar37._12_2_;
            cVar5 = (0 < sVar10) * (sVar10 < 0x100) * auVar37[0xc] - (0xff < sVar10);
            sVar10 = auVar37._14_2_;
            uVar34 = CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar37[0xe] - (0xff < sVar10),
                              CONCAT16(cVar5,uVar28));
            sVar10 = auVar32._0_2_;
            cVar6 = (0 < sVar10) * (sVar10 < 0x100) * auVar32[0] - (0xff < sVar10);
            uVar11 = auVar32._2_2_;
            auVar35._0_10_ =
                 CONCAT19((uVar11 != 0) * (uVar11 < 0x100) * auVar32[2] - (0xff < uVar11),
                          CONCAT18(cVar6,uVar34));
            sVar10 = auVar32._4_2_;
            cVar7 = (0 < sVar10) * (sVar10 < 0x100) * auVar32[4] - (0xff < sVar10);
            auVar35[10] = cVar7;
            sVar10 = auVar32._6_2_;
            auVar35[0xb] = (0 < sVar10) * (sVar10 < 0x100) * auVar32[6] - (0xff < sVar10);
            sVar10 = auVar32._8_2_;
            cVar8 = (0 < sVar10) * (sVar10 < 0x100) * auVar32[8] - (0xff < sVar10);
            auVar36[0xc] = cVar8;
            auVar36._0_12_ = auVar35;
            sVar10 = auVar32._10_2_;
            auVar36[0xd] = (0 < sVar10) * (sVar10 < 0x100) * auVar32[10] - (0xff < sVar10);
            sVar10 = auVar32._12_2_;
            cVar9 = (0 < sVar10) * (sVar10 < 0x100) * auVar32[0xc] - (0xff < sVar10);
            auVar38[0xe] = cVar9;
            auVar38._0_14_ = auVar36;
            sVar10 = auVar32._14_2_;
            auVar38[0xf] = (0 < sVar10) * (sVar10 < 0x100) * auVar32[0xe] - (0xff < sVar10);
            sVar10 = (short)((uint)uVar27 >> 0x10);
            sVar12 = (short)((uint6)uVar28 >> 0x20);
            sVar13 = (short)((ulong)uVar34 >> 0x30);
            sVar25 = (short)((unkuint10)auVar35._0_10_ >> 0x40);
            sVar14 = auVar35._10_2_;
            sVar15 = auVar36._12_2_;
            sVar16 = auVar38._14_2_;
            *(ulong *)(in_00 + lVar23) =
                 CONCAT17((0 < sVar16) * (sVar16 < 0x100) * cVar9 - (0xff < sVar16),
                          CONCAT16((0 < sVar15) * (sVar15 < 0x100) * cVar8 - (0xff < sVar15),
                                   CONCAT15((0 < sVar14) * (sVar14 < 0x100) * cVar7 -
                                            (0xff < sVar14),
                                            CONCAT14((0 < sVar25) * (sVar25 < 0x100) * cVar6 -
                                                     (0xff < sVar25),
                                                     CONCAT13((0 < sVar13) * (sVar13 < 0x100) *
                                                              cVar5 - (0xff < sVar13),
                                                              CONCAT12((0 < sVar12) *
                                                                       (sVar12 < 0x100) * cVar4 -
                                                                       (0xff < sVar12),
                                                                       CONCAT11((0 < sVar10) *
                                                                                (sVar10 < 0x100) *
                                                                                cVar3 - (0xff < 
                                                  sVar10),(0 < sVar33) * (sVar33 < 0x100) * cVar2 -
                                                          (0xff < sVar33))))))));
            lVar23 = lVar23 + 8;
          } while ((ulong)uVar24 << 3 != lVar23);
        }
      }
      uVar22 = lodepng_convert(out,in_00,&state->info_raw,&mode16,w,h);
      goto LAB_0011d7cd;
    }
  }
  else {
    uVar22 = 1;
    out_00 = (float *)0x0;
  }
  in_00 = (uchar *)0x0;
LAB_0011d7cd:
  free(icc.trc[0].lut);
  free(icc.trc[1].lut);
  free(icc.trc[2].lut);
  free(out_00);
  free(in_00);
  return uVar22;
}

Assistant:

unsigned convertFromXYZ(unsigned char* out, const float* in, unsigned w, unsigned h,
                        const LodePNGState* state,
                        const float whitepoint[3], unsigned rendering_intent) {
  unsigned error = 0;
  size_t i, c;
  size_t n = w * h;
  const LodePNGColorMode* mode_out = &state->info_raw;
  const LodePNGInfo* info = &state->info_png;
  int bit16 = mode_out->bitdepth > 8;
  float* im = 0;
  unsigned char* data = 0;

  /* parse ICC if present */
  unsigned use_icc = 0;
  LodePNGICC icc;
  lodepng_icc_init(&icc);
  if(info->iccp_defined) {
    error = parseICC(&icc, info->iccp_profile, info->iccp_profile_size);
    if(error) goto cleanup; /* corrupted ICC profile */
    use_icc = validateICC(&icc);
  }

  /* Handle gamut */
  im = (float*)lodepng_malloc(w * h * 4 * sizeof(float));
  error = convertFromXYZ_chrm(im, in, w, h, info, use_icc, &icc, whitepoint, rendering_intent);
  if(error) goto cleanup;

  /* Handle transfer function */
  /* Input is floating point, so lookup table cannot be used, but it's ensured to use float pow, not the slower double pow. */
  convertFromXYZ_gamma(im, w, h, info, use_icc, &icc);

  /* Convert to integer output */
  data = (unsigned char*)lodepng_malloc(w * h * 8);
  /* TODO: check if also 1/2/4 bit case needed: rounding is at different fine-grainedness for 8 and 16 bits below. */
  if(bit16) {
    LodePNGColorMode mode16 = lodepng_color_mode_make(LCT_RGBA, 16);
    for(i = 0; i < n; i++) {
      for(c = 0; c < 4; c++) {
        size_t j = i * 8 + c * 2;
        int i16 = (int)(0.5f + 65535.0f * LODEPNG_MIN(LODEPNG_MAX(0.0f, im[i * 4 + c]), 1.0f));
        data[j + 0] = i16 >> 8;
        data[j + 1] = i16 & 255;
      }
    }
    error = lodepng_convert(out, data, mode_out, &mode16, w, h);
    if(error) goto cleanup;
  } else {
    LodePNGColorMode mode8 = lodepng_color_mode_make(LCT_RGBA, 8);
    for(i = 0; i < n; i++) {
      for(c = 0; c < 4; c++) {
        int i8 = (int)(0.5f + 255.0f * LODEPNG_MIN(LODEPNG_MAX(0.0f, im[i * 4 + c]), 1.0f));
        data[i * 4 + c] = i8;
      }
    }
    error = lodepng_convert(out, data, mode_out, &mode8, w, h);
    if(error) goto cleanup;
  }

cleanup:
  lodepng_icc_cleanup(&icc);
  lodepng_free(im);
  lodepng_free(data);
  return error;
}